

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayoutInfo::minimumSize(QToolBarAreaLayoutInfo *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  int *piVar5;
  QList<QToolBarAreaLayoutLine> *in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutLine *l;
  int i;
  int b;
  QSize m;
  int a;
  QSize result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffa0;
  QSize *this_00;
  Orientation o;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar6;
  int iVar7;
  int local_20;
  QSize local_1c;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  iVar7 = 0;
  for (iVar6 = 0; lVar3 = (long)iVar6, qVar4 = QList<QToolBarAreaLayoutLine>::size(in_RDI),
      lVar3 < qVar4; iVar6 = iVar6 + 1) {
    QList<QToolBarAreaLayoutLine>::at
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = QToolBarAreaLayoutLine::skip
                      ((QToolBarAreaLayoutLine *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_1c = QToolBarAreaLayoutLine::minimumSize
                           ((QToolBarAreaLayoutLine *)CONCAT44(iVar7,iVar6));
      local_20 = pick((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      piVar5 = qMax<int>(&local_14,&local_20);
      local_14 = *piVar5;
      iVar2 = perp((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar7 = iVar2 + iVar7;
    }
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_10;
  QSize::QSize(this_00);
  o = (Orientation)((ulong)this_00 >> 0x20);
  iVar6 = local_14;
  piVar5 = rpick(o,(QSize *)CONCAT44(local_14,in_stack_ffffffffffffff98));
  *piVar5 = iVar6;
  piVar5 = rperp(o,(QSize *)CONCAT44(iVar6,in_stack_ffffffffffffff98));
  *piVar5 = iVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QToolBarAreaLayoutInfo::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < lines.size(); ++i) {
        const QToolBarAreaLayoutLine &l = lines.at(i);
        if (l.skip())
            continue;

        QSize m = l.minimumSize();
        a = qMax(a, pick(o, m));
        b += perp(o, m);
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}